

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.hpp
# Opt level: O2

QAction * __thiscall
QtMWidgets::ToolBar::addAction<void(Object::*)()>
          (ToolBar *this,QIcon *icon,Object *receiver,Function slot)

{
  QAction *this_00;
  QArrayDataPointer<char16_t> local_58;
  Object local_38 [8];
  
  this_00 = (QAction *)operator_new(0x10);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QAction::QAction(this_00,icon,(QString *)&local_58,(QObject *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  local_58.d = (Data *)slot;
  QObject::connect<void(QAction::*)(bool),void(Object::*)()>
            (local_38,(offset_in_QAction_to_subr)this_00,(Object *)QAction::triggered,0,
             (ConnectionType)receiver);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QWidget::addAction((QAction *)this);
  return this_00;
}

Assistant:

inline QAction * addAction( const QIcon & icon,
		const typename QtPrivate::FunctionPointer< Func1 >::Object * receiver,
		Func1 slot )
	{
		QAction * action = new QAction( icon, QString(), this );
		QObject::connect( action, &QAction::triggered, receiver, slot );
		addAction( action );
		return action;
	}